

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall
BN::expLeftToRightK_ary
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g)

{
  ushort uVar1;
  pointer puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  puVar2 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(exponent->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2) < 3) && (*puVar2 == 0)) {
    bn1();
  }
  else {
    bn1();
    uVar3 = (ulong)((long)(exponent->ba).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(exponent->ba).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 1 & 0xffffffff;
    while( true ) {
      uVar3 = uVar3 - 1;
      if ((int)uVar3 < 0) break;
      uVar1 = *(ushort *)
               ((long)(exponent->ba).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + (ulong)(uint)((int)uVar3 * 2));
      for (uVar5 = 1; uVar5 < 2; uVar5 = uVar5 - 1) {
        lVar4 = 8;
        while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
          Qrt((BN *)&local_60,__return_storage_ptr__);
          operator%((BN *)&local_48,(BN *)&local_60,mod);
          operator=(__return_storage_ptr__,(BN *)&local_48);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&local_48);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&local_60);
        }
        karatsubaMultiplication
                  ((BN *)&local_60,__return_storage_ptr__,
                   (g->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                   _M_start + (uVar1 >> ((char)uVar5 * '\b' & 0x1fU) & 0xff));
        operator%((BN *)&local_48,(BN *)&local_60,mod);
        operator=(__return_storage_ptr__,(BN *)&local_48);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expLeftToRightK_ary(const BN& exponent, const BN& mod, const vector<BN>& g) const {
    if(exponent.is0())
        return BN::bn1();

    BN A(BN::bn1());
    for(int i = exponent.ba.size() - 1; i >= 0; i--) {
        bt value = exponent.ba[i];
        for (size_t b = bz - 1; b < bz; --b) {
            for(size_t k = 0; k < KaryBits; k++)
                A = A.Qrt() % mod;
            A = A * g[(value >> KaryBits * b) & KaryMask] % mod;
        }
    }
    return A;
}